

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

void fulfill_or_reject_promise(JSContext *ctx,JSValue promise,JSValue value,BOOL is_reject)

{
  int *piVar1;
  JSHostPromiseRejectionTracker *pJVar2;
  JSPromiseReactionData *pJVar3;
  list_head *plVar4;
  list_head *plVar5;
  JSRefCountHeader *p;
  JSValueUnion JVar6;
  JSPromiseReactionData *pJVar7;
  uint local_a0;
  JSValueUnion local_88;
  int64_t iStack_80;
  JSValueUnion local_78;
  int64_t iStack_70;
  JSValueUnion local_68;
  int64_t iStack_60;
  ulong local_58;
  undefined8 local_50;
  JSValueUnion local_48;
  int64_t local_40;
  
  JVar6 = value.u;
  local_a0 = (uint)value.tag;
  if (((((int)promise.tag == -1) && (*(short *)((long)promise.u.ptr + 6) == 0x2a)) &&
      (piVar1 = *(int **)((long)promise.u.ptr + 0x30), piVar1 != (int *)0x0)) && (*piVar1 == 0)) {
    if (0xfffffff4 < local_a0) {
      *(int *)JVar6.ptr = *JVar6.ptr + 1;
    }
    set_value(ctx,(JSValue *)(piVar1 + 0xc),value);
    *piVar1 = is_reject + 1;
    if ((is_reject + 1 == 2) && (piVar1[10] == 0)) {
      pJVar2 = ctx->rt->host_promise_rejection_tracker;
      if (pJVar2 != (JSHostPromiseRejectionTracker *)0x0) {
        (*pJVar2)(ctx,promise,value,0,ctx->rt->host_promise_rejection_tracker_opaque);
      }
    }
    pJVar7 = *(JSPromiseReactionData **)(piVar1 + (long)is_reject * 4 + 4);
    while (pJVar7 != (JSPromiseReactionData *)(piVar1 + (long)is_reject * 4 + 2)) {
      pJVar3 = (JSPromiseReactionData *)(pJVar7->link).next;
      local_88 = pJVar7->resolving_funcs[0].u;
      iStack_80 = pJVar7->resolving_funcs[0].tag;
      local_78 = pJVar7->resolving_funcs[1].u;
      iStack_70 = pJVar7->resolving_funcs[1].tag;
      local_68 = (pJVar7->handler).u;
      iStack_60 = (pJVar7->handler).tag;
      local_50 = 1;
      local_40 = value.tag;
      local_58 = (ulong)(is_reject != 0);
      local_48 = JVar6;
      JS_EnqueueJob(ctx,promise_reaction_job,5,(JSValue *)&local_88);
      plVar4 = (pJVar7->link).prev;
      plVar5 = (pJVar7->link).next;
      plVar4->next = plVar5;
      plVar5->prev = plVar4;
      (pJVar7->link).prev = (list_head *)0x0;
      (pJVar7->link).next = (list_head *)0x0;
      promise_reaction_data_free(ctx->rt,pJVar7);
      pJVar7 = pJVar3;
    }
    pJVar7 = *(JSPromiseReactionData **)(piVar1 + (long)(1 - is_reject) * 4 + 4);
    while (pJVar7 != (JSPromiseReactionData *)(piVar1 + (long)(1 - is_reject) * 4 + 2)) {
      plVar4 = (pJVar7->link).prev;
      pJVar3 = (JSPromiseReactionData *)(pJVar7->link).next;
      plVar4->next = (list_head *)pJVar3;
      (pJVar3->link).prev = plVar4;
      (pJVar7->link).prev = (list_head *)0x0;
      (pJVar7->link).next = (list_head *)0x0;
      promise_reaction_data_free(ctx->rt,pJVar7);
      pJVar7 = pJVar3;
    }
  }
  return;
}

Assistant:

static void fulfill_or_reject_promise(JSContext *ctx, JSValueConst promise,
                                      JSValueConst value, BOOL is_reject)
{
    JSPromiseData *s = JS_GetOpaque(promise, JS_CLASS_PROMISE);
    struct list_head *el, *el1;
    JSPromiseReactionData *rd;
    JSValueConst args[5];

    if (!s || s->promise_state != JS_PROMISE_PENDING)
        return; /* should never happen */
    set_value(ctx, &s->promise_result, JS_DupValue(ctx, value));
    s->promise_state = JS_PROMISE_FULFILLED + is_reject;
#ifdef DUMP_PROMISE
    printf("fulfill_or_reject_promise: is_reject=%d\n", is_reject);
#endif
    if (s->promise_state == JS_PROMISE_REJECTED && !s->is_handled) {
        JSRuntime *rt = ctx->rt;
        if (rt->host_promise_rejection_tracker) {
            rt->host_promise_rejection_tracker(ctx, promise, value, FALSE,
                                               rt->host_promise_rejection_tracker_opaque);
        }
    }

    list_for_each_safe(el, el1, &s->promise_reactions[is_reject]) {
        rd = list_entry(el, JSPromiseReactionData, link);
        args[0] = rd->resolving_funcs[0];
        args[1] = rd->resolving_funcs[1];
        args[2] = rd->handler;
        args[3] = JS_NewBool(ctx, is_reject);
        args[4] = value;
        JS_EnqueueJob(ctx, promise_reaction_job, 5, args);
        list_del(&rd->link);
        promise_reaction_data_free(ctx->rt, rd);
    }

    list_for_each_safe(el, el1, &s->promise_reactions[1 - is_reject]) {
        rd = list_entry(el, JSPromiseReactionData, link);
        list_del(&rd->link);
        promise_reaction_data_free(ctx->rt, rd);
    }
}